

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

int mapApproxHeight(float *y,int *ids,Generator *g,SurfaceNoise *sn,int x,int z,int w,int h)

{
  float fVar1;
  Range r_00;
  Range r_01;
  int iVar2;
  int x_00;
  void *__ptr;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int samplez;
  int iVar11;
  undefined4 *puVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  int y_00;
  int iVar17;
  long lVar18;
  long lVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_5408;
  float *local_53f8;
  double local_53d8;
  long local_53b8;
  double d0;
  double local_5350;
  long local_5340;
  OctaveNoise *local_5338;
  float *local_5330;
  long local_5328;
  double s;
  double d;
  double s0;
  Range r;
  long local_52e8;
  
  if (g->dim == -1) {
    return 0x7f;
  }
  if (g->dim == 1) {
    if (0xb < g->mc) {
      iVar2 = mapEndSurfaceHeight(y,&g->en,sn,x,z,w,h,4,0);
      return iVar2;
    }
LAB_00114be9:
    iVar2 = 1;
  }
  else {
    local_53f8 = y;
    if (g->mc < 0x16) {
      if (g->mc < 2) {
        initSurfaceNoiseBeta((SurfaceNoiseBeta *)&r,g->seed);
        lVar8 = (long)w;
        uVar9 = 0;
        lVar4 = 0;
        if (0 < lVar8) {
          lVar4 = lVar8;
        }
        uVar14 = (ulong)(uint)h;
        if (h < 1) {
          uVar14 = uVar9;
        }
        for (; uVar9 != uVar14; uVar9 = uVar9 + 1) {
          for (lVar18 = 0; lVar4 * 4 != lVar18; lVar18 = lVar18 + 4) {
            dVar24 = approxSurfaceBeta((BiomeNoiseBeta *)&(g->field_5).field_0,
                                       (SurfaceNoiseBeta *)&r,(x << 2 | 2U) + (int)lVar18,
                                       (z + (int)uVar9) * 4 + 2);
            *(float *)((long)local_53f8 + lVar18) = (float)dVar24;
          }
          local_53f8 = local_53f8 + lVar8;
        }
      }
      else {
        lVar18 = (long)w;
        lVar8 = (long)h;
        __ptr = malloc(lVar18 * lVar8 * 0x10);
        r.scale = 4;
        r.x = x + -2;
        r.z = z + -2;
        r.sx = w + 5;
        r.sz = h + 5;
        r.y = 0;
        r.sy = 1;
        r_00.x = r.x;
        r_00.scale = 4;
        r_00.z = r.z;
        r_00.sx = r.sx;
        r_00.sz = r.sz;
        r_00.y = 0;
        r_00.sy = 1;
        piVar3 = allocCache(g,r_00);
        r_01.x = r.x;
        r_01.scale = r.scale;
        r_01.z = r.z;
        r_01.sx = r.sx;
        r_01.sz = r.sz;
        r_01.y = r.y;
        r_01.sy = r.sy;
        genBiomes(g,piVar3,r_01);
        lVar4 = 0;
        if (0 < lVar18) {
          lVar4 = lVar18;
        }
        local_53b8 = 0;
        if (lVar8 < 1) {
          lVar8 = 0;
        }
        for (lVar5 = 0; lVar5 != lVar8; lVar5 = lVar5 + 1) {
          piVar15 = piVar3;
          for (lVar10 = 0; lVar10 != lVar4; lVar10 = lVar10 + 1) {
            iVar2 = piVar3[(long)r.sx * (lVar5 + 2) + lVar10 + 2];
            getBiomeDepthAndScale(iVar2,&d0,&s0,(int *)0x0);
            dVar24 = 0.0;
            dVar25 = 0.0;
            dVar26 = 0.0;
            puVar12 = &DAT_00127080;
            lVar19 = local_53b8;
            for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
              for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
                getBiomeDepthAndScale
                          (*(int *)((long)piVar15 + lVar16 * 4 + r.sx * lVar19),&d,&s,(int *)0x0);
                fVar23 = (float)((double)(float)puVar12[lVar16] / (d + 2.0));
                fVar1 = fVar23 * 0.5;
                if (d <= d0) {
                  fVar1 = fVar23;
                }
                dVar22 = (double)fVar1;
                dVar26 = dVar26 + dVar22;
                dVar24 = dVar24 + dVar22 * s;
                dVar25 = dVar25 + dVar22 * d;
              }
              lVar19 = lVar19 + 4;
              puVar12 = puVar12 + 5;
            }
            lVar19 = lVar5 * lVar18 + lVar10;
            *(double *)((long)__ptr + lVar19 * 8) =
                 ((dVar25 / dVar26) * 4.0 + -1.0) * 0.125 * 17.0 * 0.015625;
            *(double *)((long)__ptr + lVar19 * 8 + (long)(h * w) * 8) =
                 96.0 / ((dVar24 / dVar26) * 0.9 + 0.1);
            if (ids != (int *)0x0) {
              ids[lVar19] = iVar2;
            }
            piVar15 = piVar15 + 1;
          }
          local_53b8 = local_53b8 + 4;
        }
        free(piVar3);
        local_5338 = &sn->octdepth;
        lVar5 = 0;
        while (lVar5 != lVar8) {
          iVar2 = z + (int)lVar5;
          local_5328 = lVar5 * lVar18;
          local_5330 = y + local_5328;
          local_5340 = lVar5;
          for (lVar10 = 0; lVar10 != lVar4; lVar10 = lVar10 + 1) {
            x_00 = x + (int)lVar10;
            dVar24 = sampleOctaveAmp(local_5338,(double)(x_00 * 200),10.0,(double)(iVar2 * 200),1.0,
                                     0.0,1);
            dVar24 = dVar24 * 8.191875;
            dVar25 = (double)(~-(ulong)(dVar24 < 0.0) & (ulong)dVar24 |
                             (ulong)(dVar24 * -0.3) & -(ulong)(dVar24 < 0.0)) * 3.0 + -2.0;
            dVar24 = 1.0;
            if (dVar25 <= 1.0) {
              dVar24 = dVar25;
            }
            local_53d8 = 0.0;
            dVar25 = *(double *)(&DAT_00127068 + (ulong)(dVar24 * 0.265625 < 0.0) * 8);
            lVar5 = local_5328 + lVar10;
            iVar13 = 0;
            local_5408 = 0.0;
            iVar7 = 8;
            iVar11 = 0x20;
            do {
              iVar17 = iVar7 * 2;
              for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
                y_00 = iVar7 + (int)lVar19;
                dVar26 = sampleSurfaceNoise(sn,x_00,y_00,iVar2);
                dVar22 = ((double)iVar17 * -0.03125 + 1.0 + dVar24 * 0.265625 * dVar25 + -0.46875 +
                         *(double *)((long)__ptr + lVar5 * 8)) *
                         *(double *)((long)__ptr + lVar5 * 8 + (long)(h * w) * 8);
                dVar26 = (double)(~-(ulong)(0.0 < dVar22) & (ulong)dVar22 |
                                 (ulong)(dVar22 * 4.0) & -(ulong)(0.0 < dVar22)) + dVar26;
                (&d0)[lVar19] = dVar26;
                if (0.0 <= dVar26 && (long)iVar13 < iVar7 + lVar19) {
                  local_53d8 = dVar26;
                  iVar13 = y_00;
                }
                if (dVar26 < 0.0 && iVar7 + lVar19 < (long)iVar11) {
                  local_5408 = dVar26;
                  iVar11 = y_00;
                }
                iVar17 = iVar17 + 2;
              }
              dVar26 = d0 / (d0 - local_5350);
              if (dVar26 <= 0.0) {
                dVar26 = floor(dVar26);
                uVar20 = SUB84(dVar26,0);
                uVar21 = (undefined4)((ulong)dVar26 >> 0x20);
              }
              else {
                dVar26 = ceil(dVar26);
                uVar20 = SUB84(dVar26,0);
                uVar21 = (undefined4)((ulong)dVar26 >> 0x20);
              }
              iVar7 = iVar7 + (int)(double)CONCAT44(uVar21,uVar20);
              iVar17 = iVar13 + 1;
              if (iVar13 < iVar7) {
                iVar17 = iVar7;
              }
              iVar7 = iVar11 + -1;
              if (iVar17 < iVar11) {
                iVar7 = iVar17;
              }
            } while (1 < iVar11 - iVar13);
            local_5330[lVar10] =
                 (float)(((double)iVar13 + local_53d8 / (local_53d8 - local_5408)) * 8.0);
          }
          lVar5 = local_5340 + 1;
        }
        free(__ptr);
      }
    }
    else {
      iVar2 = *(int *)((long)&g->field_5 + 0x6008);
      if ((iVar2 != 4) && (iVar2 != -1)) goto LAB_00114be9;
      lVar8 = (long)w;
      lVar4 = 0;
      if (0 < lVar8) {
        lVar4 = lVar8;
      }
      if (h < 1) {
        h = 0;
      }
      piVar3 = ids;
      for (uVar9 = 0; uVar9 != (uint)h; uVar9 = uVar9 + 1) {
        for (lVar18 = 0; lVar4 != lVar18; lVar18 = lVar18 + 1) {
          iVar2 = sampleBiomeNoise((BiomeNoise *)&(g->field_5).field_0,(int64_t *)&r,x + (int)lVar18
                                   ,0,(int)uVar9 + z,(uint64_t *)0x0,0);
          if (ids != (int *)0x0) {
            piVar3[lVar18] = iVar2;
          }
          local_53f8[lVar18] = (float)((double)local_52e8 / 76.0);
        }
        local_53f8 = local_53f8 + lVar8;
        piVar3 = piVar3 + lVar8;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapApproxHeight(float *y, int *ids, const Generator *g, const SurfaceNoise *sn,
    int x, int z, int w, int h)
{
    if (g->dim == DIM_NETHER)
        return 127;

    if (g->dim == DIM_END)
    {
        if (g->mc <= MC_1_8)
            return 1;
        return mapEndSurfaceHeight(y, &g->en, sn, x, z, w, h, 4, 0);
    }

    if (g->mc >= MC_1_18)
    {
        if (g->bn.nptype != -1 && g->bn.nptype != NP_DEPTH)
            return 1;
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int flags = 0;//SAMPLE_NO_SHIFT;
                int64_t np[6];
                int id = sampleBiomeNoise(&g->bn, np, x+i, 0, z+j, 0, flags);
                if (ids)
                    ids[j*w+i] = id;
                y[j*w+i] = np[NP_DEPTH] / 76.0;
            }
        }
        return 0;
    }
    else if (g->mc <= MC_B1_7)
    {
        SurfaceNoiseBeta snb; // TODO: merge SurfaceNoise and SurfaceNoiseBeta?
        initSurfaceNoiseBeta(&snb, g->seed);
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int samplex = (x + i) * 4 + 2;
                int samplez = (z + j) * 4 + 2;
                // TODO: properly implement beta surface finder
                y[j*w+i] = approxSurfaceBeta(&g->bnb, &snb, samplex, samplez);
            }
        }
        return 0;
    }

    const float biome_kernel[25] = { // with 10 / (sqrt(i**2 + j**2) + 0.2)
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        4.545454545, 8.333333333, 50.00000000, 8.333333333, 4.545454545,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
    };

    double *depth = (double*) malloc(sizeof(double) * 2 * w * h);
    double *scale = depth + w * h;
    int64_t i, j;
    int ii, jj;

    Range r = {4, x-2, z-2, w+5, h+5, 0, 1};
    int *cache = allocCache(g, r);
    genBiomes(g, cache, r);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            double d0, s0;
            double wt = 0, ws = 0, wd = 0;
            int id0 = cache[(j+2)*r.sx + (i+2)];
            getBiomeDepthAndScale(id0, &d0, &s0, 0);

            for (jj = 0; jj < 5; jj++)
            {
                for (ii = 0; ii < 5; ii++)
                {
                    double d, s;
                    int id = cache[(j+jj)*r.sx + (i+ii)];
                    getBiomeDepthAndScale(id, &d, &s, 0);
                    float weight = biome_kernel[jj*5+ii] / (d + 2);
                    if (d > d0)
                        weight *= 0.5;
                    ws += s * weight;
                    wd += d * weight;
                    wt += weight;
                }
            }
            ws /= wt;
            wd /= wt;
            ws = ws * 0.9 + 0.1;
            wd = (wd * 4.0 - 1) / 8;
            ws = 96 / ws;
            wd = wd * 17./64;
            depth[j*w+i] = wd;
            scale[j*w+i] = ws;
            if (ids)
                ids[j*w+i] = id0;
        }
    }
    free(cache);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int px = x+i, pz = z+j;
            double off = sampleOctaveAmp(&sn->octdepth, px*200, 10, pz*200, 1, 0, 1);
            off *= 65535./8000;
            if (off < 0) off = -0.3 * off;
            off = off * 3 - 2;
            if (off > 1) off = 1;
            off *= 17./64;
            if (off < 0) off *= 1./28;
            else off *= 1./40;

            double vmin = 0, vmax = 0;
            int ytest = 8, ymin = 0, ymax = 32;
            do
            {
                double v[2];
                int k;
                for (k = 0; k < 2; k++)
                {
                    int py = ytest + k;
                    double n0 = sampleSurfaceNoise(sn, px, py, pz);
                    double fall = 1 - 2 * py / 32.0 + off - 0.46875;
                    fall = scale[j*w+i] * (fall + depth[j*w+i]);
                    n0 += (fall > 0 ? 4*fall : fall);
                    v[k] = n0;
                    if (n0 >= 0 && py > ymin)
                    {
                        ymin = py;
                        vmin = n0;
                    }
                    if (n0 < 0 && py < ymax)
                    {
                        ymax = py;
                        vmax = n0;
                    }
                }
                double dy = v[0] / (v[0] - v[1]);
                dy = (dy <= 0 ? floor(dy) : ceil(dy)); // round away from zero
                ytest += (int) dy;
                if (ytest <= ymin) ytest = ymin+1;
                if (ytest >= ymax) ytest = ymax-1;
            }
            while (ymax - ymin > 1);

            y[j*w+i] = 8 * (vmin / (double)(vmin - vmax) + ymin);
        }
    }
    free(depth);
    return 0;
}